

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

op_t * force_val(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,int arr_p)

{
  op_t mem;
  MIR_context_t ctx_00;
  bool bVar1;
  MIR_op_t op1;
  MIR_op_t op3;
  MIR_op_t op3_00;
  MIR_op_t op2;
  MIR_op_t op1_00;
  MIR_op_t op2_00;
  MIR_op_t op1_01;
  int iVar2;
  MIR_insn_code_t code;
  undefined1 auVar3 [64];
  MIR_op_t local_118;
  MIR_op_t local_e8;
  op_t local_b8;
  int local_6c;
  undefined1 local_68 [4];
  int sh;
  op_t temp_op;
  MIR_context_t ctx;
  int arr_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ctx_00 = c2m_ctx->ctx;
  if ((arr_p == 0) || ((op.mir_op._8_2_ & 0xff) != 10)) {
    if ((op.decl == (decl_t)0x0) || ((op.decl)->bit_offset < 0)) {
      memcpy(__return_storage_ptr__,&op,0x40);
    }
    else {
      if ((op.mir_op._8_2_ & 0xff) != 10) {
        __assert_fail("op.mir_op.mode == MIR_OP_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2a16,"op_t force_val(c2m_ctx_t, op_t, int)");
      }
      get_new_temp(&local_b8,c2m_ctx,MIR_T_I64);
      memcpy(local_68,&local_b8,0x40);
      op1._8_8_ = temp_op.mir_op.data;
      op1.data = (void *)temp_op._8_8_;
      op1.u.i = temp_op.mir_op._8_8_;
      op1.u._8_8_ = temp_op.mir_op.u.i;
      op1.u._16_8_ = temp_op.mir_op.u.str.s;
      op1.u.mem.disp = temp_op.mir_op.u._16_8_;
      emit2(c2m_ctx,MIR_MOV,op1,op.mir_op);
      local_6c = (0x40 - (op.decl)->bit_offset) - (op.decl)->width;
      if (local_6c != 0) {
        MIR_new_int_op(&local_e8,ctx_00,(long)local_6c);
        op2._8_8_ = temp_op.mir_op.data;
        op2.data = (void *)temp_op._8_8_;
        op2.u.i = temp_op.mir_op._8_8_;
        op2.u._8_8_ = temp_op.mir_op.u.i;
        op2.u._16_8_ = temp_op.mir_op.u.str.s;
        op2.u.mem.disp = temp_op.mir_op.u._16_8_;
        op1_00._8_8_ = temp_op.mir_op.data;
        op1_00.data = (void *)temp_op._8_8_;
        op1_00.u.i = temp_op.mir_op._8_8_;
        op1_00.u._8_8_ = temp_op.mir_op.u.i;
        op1_00.u._16_8_ = temp_op.mir_op.u.str.s;
        op1_00.u.mem.disp = temp_op.mir_op.u._16_8_;
        op3._8_8_ = local_e8._8_8_;
        op3.data = local_e8.data;
        op3.u.i = local_e8.u.i;
        op3.u.str.s = local_e8.u.str.s;
        op3.u._16_8_ = local_e8.u._16_8_;
        op3.u.mem.disp = local_e8.u.mem.disp;
        emit3(c2m_ctx,MIR_LSH,op1_00,op2,op3);
      }
      iVar2 = signed_integer_type_p(((op.decl)->decl_spec).type);
      bVar1 = false;
      if ((iVar2 != 0) && (bVar1 = true, (((op.decl)->decl_spec).type)->mode == TM_ENUM)) {
        bVar1 = 0x1f < (op.decl)->width;
      }
      code = MIR_URSH;
      if (bVar1) {
        code = MIR_RSH;
      }
      MIR_new_int_op(&local_118,ctx_00,(long)(0x40 - (op.decl)->width));
      op2_00._8_8_ = temp_op.mir_op.data;
      op2_00.data = (void *)temp_op._8_8_;
      op2_00.u.i = temp_op.mir_op._8_8_;
      op2_00.u._8_8_ = temp_op.mir_op.u.i;
      op2_00.u._16_8_ = temp_op.mir_op.u.str.s;
      op2_00.u.mem.disp = temp_op.mir_op.u._16_8_;
      op1_01._8_8_ = temp_op.mir_op.data;
      op1_01.data = (void *)temp_op._8_8_;
      op1_01.u.i = temp_op.mir_op._8_8_;
      op1_01.u._8_8_ = temp_op.mir_op.u.i;
      op1_01.u._16_8_ = temp_op.mir_op.u.str.s;
      op1_01.u.mem.disp = temp_op.mir_op.u._16_8_;
      op3_00._8_8_ = local_118._8_8_;
      op3_00.data = local_118.data;
      op3_00.u.i = local_118.u.i;
      op3_00.u.str.s = local_118.u.str.s;
      op3_00.u._16_8_ = local_118.u._16_8_;
      op3_00.u.mem.disp = local_118.u.mem.disp;
      emit3(c2m_ctx,code,op1_01,op2_00,op3_00);
      memcpy(__return_storage_ptr__,local_68,0x40);
    }
  }
  else {
    auVar3 = vmovdqu64_avx512f((undefined1  [64])op);
    mem = (op_t)vmovdqu64_avx512f(auVar3);
    mem_to_address(__return_storage_ptr__,c2m_ctx,mem,0);
  }
  return __return_storage_ptr__;
}

Assistant:

static op_t force_val (c2m_ctx_t c2m_ctx, op_t op, int arr_p) {
  MIR_context_t ctx = c2m_ctx->ctx;
  op_t temp_op;
  int sh;

  if (arr_p && op.mir_op.mode == MIR_OP_MEM) {
    /* an array -- use a pointer: */
    return mem_to_address (c2m_ctx, op, FALSE);
  }
  if (op.decl == NULL || op.decl->bit_offset < 0) return op;
  assert (op.mir_op.mode == MIR_OP_MEM);
  temp_op = get_new_temp (c2m_ctx, MIR_T_I64);
  emit2 (c2m_ctx, MIR_MOV, temp_op.mir_op, op.mir_op); /* ??? */
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  sh = 64 - op.decl->bit_offset - op.decl->width;
#else
  sh = op.decl->bit_offset + (64 - type_size (c2m_ctx, op.decl->decl_spec.type) * MIR_CHAR_BIT);
#endif
  if (sh != 0) emit3 (c2m_ctx, MIR_LSH, temp_op.mir_op, temp_op.mir_op, MIR_new_int_op (ctx, sh));
  emit3 (c2m_ctx,
         signed_integer_type_p (op.decl->decl_spec.type)
             && (op.decl->decl_spec.type->mode != TM_ENUM
                 || op.decl->width >= (int) sizeof (mir_int) * MIR_CHAR_BIT)
           ? MIR_RSH
           : MIR_URSH,
         temp_op.mir_op, temp_op.mir_op, MIR_new_int_op (ctx, 64 - op.decl->width));
  return temp_op;
}